

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

bool read_from_descriptor(DESCRIPTOR_DATA *d)

{
  char *__s;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  char *local_28;
  
  bVar7 = true;
  if (d->incomm[0] == '\0') {
    __s = d->inbuf;
    uVar3 = strlen(__s);
    if (((uint)uVar3 & 0xfffffffe) < 0x47f6) {
      do {
        uVar8 = uVar3 & 0xffffffff;
        sVar4 = read((int)d->descriptor,__s + uVar8,0x47f6 - uVar8);
        iVar6 = (int)sVar4;
        if (iVar6 < 1) {
          if (iVar6 == 0) {
            fmt_01._M_str = "EOF encountered on read.";
            fmt_01._M_len = 0x18;
            CLogger::Info<>((CLogger *)&RS.field_0x140,fmt_01);
          }
          else {
            piVar5 = __errno_location();
            if (*piVar5 == 0xb) goto LAB_00274209;
            local_28 = strerror(*piVar5);
            fmt_00._M_str = "Init_descriptor: read: {}";
            fmt_00._M_len = 0x19;
            CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_00,&local_28);
          }
          return false;
        }
        iVar1 = (int)uVar3;
        uVar2 = iVar1 + iVar6;
        uVar3 = (ulong)uVar2;
      } while ((__s[(iVar6 + iVar1) - 1] != '\n') && (__s[(iVar6 + iVar1) - 1] != '\r'));
      uVar8 = (ulong)uVar2;
LAB_00274209:
      __s[uVar8] = '\0';
    }
    else {
      fmt._M_str = "{} input overflow!";
      fmt._M_len = 0x12;
      CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&d->host);
      bVar7 = false;
      write_to_descriptor((int)d->descriptor,"\n\r*** PUT A LID ON IT!!! ***\n\r",0);
    }
  }
  return bVar7;
}

Assistant:

bool read_from_descriptor(DESCRIPTOR_DATA *d)
{
	unsigned int iStart;

	/* Hold horses if pending command already. */
	if (d->incomm[0] != '\0')
		return true;

	/* Check for overflow. */
	iStart = strlen(d->inbuf);
	if (iStart >= sizeof(d->inbuf) - 10)
	{
		RS.Logger.Info("{} input overflow!", d->host);

		write_to_descriptor(d->descriptor, "\n\r*** PUT A LID ON IT!!! ***\n\r", 0);
		return false;
	}

	for (;;)
	{
		int nRead = read(d->descriptor, d->inbuf + iStart, sizeof(d->inbuf) - 10 - iStart);

		if (nRead > 0)
		{
			iStart += nRead;

			if (d->inbuf[iStart - 1] == '\n' || d->inbuf[iStart - 1] == '\r')
				break;
		}
		else if (nRead == 0)
		{
			RS.Logger.Info("EOF encountered on read.");
			return false;
		}
		else if (errno == EAGAIN)
		{
			break;
		}
		else
		{
			RS.Logger.Warn("Init_descriptor: read: {}", std::strerror(errno));
			return false;
		}
	}

	d->inbuf[iStart] = '\0';
	return true;
}